

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_1::WatWriter::~WatWriter(WatWriter *this)

{
  void *pvVar1;
  pointer pLVar2;
  pointer pTVar3;
  pointer pcVar4;
  long lVar5;
  pointer pLVar6;
  
  lVar5 = 0xf0;
  do {
    pvVar1 = *(void **)((long)&this->options_ + lVar5);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != 0x78);
  std::
  _Rb_tree<std::pair<wabt::ExternalKind,_unsigned_int>,_std::pair<const_std::pair<wabt::ExternalKind,_unsigned_int>,_const_wabt::Export_*>,_std::_Select1st<std::pair<const_std::pair<wabt::ExternalKind,_unsigned_int>,_const_wabt::Export_*>_>,_std::less<std::pair<wabt::ExternalKind,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<wabt::ExternalKind,_unsigned_int>,_const_wabt::Export_*>_>_>
  ::~_Rb_tree(&(this->inline_export_map_)._M_t);
  std::
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  ::~vector(&this->expr_tree_stack_);
  pLVar2 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pLVar6 = (this->label_stack_).
                super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                ._M_impl.super__Vector_impl_data._M_start; pLVar6 != pLVar2; pLVar6 = pLVar6 + 1) {
    pTVar3 = (pLVar6->result_types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pTVar3 != (pointer)0x0) {
      operator_delete(pTVar3);
    }
    pTVar3 = (pLVar6->param_types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pTVar3 != (pointer)0x0) {
      operator_delete(pTVar3);
    }
    pcVar4 = (pLVar6->name)._M_dataplus._M_p;
    if (&(pLVar6->name).field_2 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4) {
      operator_delete(pcVar4);
    }
  }
  pLVar6 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pLVar6 != (pointer)0x0) {
    operator_delete(pLVar6);
    return;
  }
  return;
}

Assistant:

WatWriter(Stream* stream, const WriteWatOptions& options)
      : options_(options), stream_(stream) {}